

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::Move(Polymer *this,int pol_index)

{
  MobileElementManager *this_00;
  int stop;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  int iVar3;
  SpeciesTracker *pSVar4;
  element_type *peVar5;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  undefined1 auVar6 [8];
  Ptr pol;
  Ptr transcript;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  pointer local_58;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)&local_78,(int)this_00);
  iVar3 = (local_78._M_ptr)->start_;
  stop = (local_78._M_ptr)->stop_;
  (*(local_78._M_ptr)->_vptr_MobileElement[2])();
  bVar2 = CheckPolCollisions(this,pol_index);
  if (bVar2) {
    (*(local_78._M_ptr)->_vptr_MobileElement[3])();
  }
  else {
    if ((local_78._M_ptr)->polymerasereadthrough_ == true) {
      std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&local_78);
      bVar2 = CheckReadthroughPolCollisions(this,(Ptr *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if (bVar2) {
        (*(local_78._M_ptr)->_vptr_MobileElement[3])();
        goto LAB_001166de;
      }
    }
    std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,&local_78);
    bVar2 = CheckMaskCollisions(this,(Ptr *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    if (bVar2) {
      (*(local_78._M_ptr)->_vptr_MobileElement[3])();
    }
    else {
      bVar2 = std::operator==(&(local_78._M_ptr)->name_,"__ribosome");
      if (bVar2) {
        pSVar4 = SpeciesTracker::Instance();
        if ((pSVar4->codon_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          MobileElementManager::DecrementtRNA(this_00,stop);
        }
      }
      CheckBehind(this,iVar3,(local_78._M_ptr)->start_);
      bVar2 = std::operator==(&(local_78._M_ptr)->name_,"__rnase");
      if (bVar2) {
        CheckAheadRnase(this,stop,(local_78._M_ptr)->stop_);
      }
      else {
        CheckAhead(this,stop,(local_78._M_ptr)->stop_);
      }
      bVar2 = CheckTermination(this,pol_index);
      if (bVar2) {
        bVar2 = std::operator!=(&(local_78._M_ptr)->name_,"__rnase");
        if (bVar2) {
          local_58 = (pointer)0x0;
          local_68 = (undefined1  [8])0x0;
          _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
                    (&this->binding_sites_,(long)iVar3,(long)(local_78._M_ptr)->stop_,
                     (intervalVector *)local_68);
          _Var1._M_pi = _Stack_60._M_pi;
          for (auVar6 = local_68; auVar6 != (undefined1  [8])_Var1._M_pi;
              auVar6 = (undefined1  [8])((long)auVar6 + 0x20)) {
            peVar5 = (((pointer)auVar6)->value).
                     super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar3 = (peVar5->super_FixedElement).covered_;
            if (0 < iVar3) {
              iVar3 = iVar3 + -1;
              (peVar5->super_FixedElement).covered_ = iVar3;
            }
            if (iVar3 == 0 && 0 < (peVar5->super_FixedElement).old_covered_) {
              LogUncover(this,&(peVar5->super_FixedElement).name_);
              peVar5 = (((pointer)auVar6)->value).
                       super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              iVar3 = (peVar5->super_FixedElement).covered_;
            }
            (peVar5->super_FixedElement).old_covered_ = iVar3;
          }
          std::
          vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
          ::~vector((vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                     *)local_68);
          goto LAB_001166de;
        }
      }
      MobileElementManager::GetAttached((MobileElementManager *)local_68,(int)this_00);
      if (local_68 != (undefined1  [8])0x0) {
        (**(code **)(*(unsigned_long *)local_68 + 0x10))();
      }
      bVar2 = std::operator==(&(local_78._M_ptr)->name_,"__ribosome");
      if (bVar2) {
        MobileElementManager::UpdatePropensity(this_00,pol_index);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
    }
  }
LAB_001166de:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
  return;
}

Assistant:

void Polymer::Move(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index); 

  // Record old positions
  int old_start = pol->start();
  int old_stop = pol->stop();

  // Move polymerase
  pol->Move();

  // Check for upstream polymerase collision
  bool pol_collision = CheckPolCollisions(pol_index);
  if (pol_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Check for collisions with polymerases at the start of the genome,
  // if simulating readthrough on a circular plasmid
  if (pol->polymerasereadthrough()) {
    bool readthrough_collision = CheckReadthroughPolCollisions(pol);
    if (readthrough_collision) {
      pol->MoveBack();
      return;
    }
  }

  // Check for collisions with mask
  bool mask_collision = CheckMaskCollisions(pol);
  if (mask_collision) {
    //pol->MoveBack();
    pol->MoveBack();
    return;
  }

  // Choose a tRNA to consume, if pol is a ribosome AND 
  // the simulation is using tRNAs
  if (pol->name() == "__ribosome" && !SpeciesTracker::Instance().codon_map().empty()) {
    polymerases_.DecrementtRNA(old_stop);
  }

  // Check for new covered and uncovered elements
  CheckBehind(old_start, pol->start());
  if (pol->name() == "__rnase") {
    CheckAheadRnase(old_stop, pol->stop());
  } else {
    CheckAhead(old_stop, pol->stop());
  }
  
  // Check if polymerase has run into a terminator
  bool terminating = CheckTermination(pol_index);
  if (terminating && pol->name() != "__rnase") {
    std::vector<Interval<BindingSite::Ptr>> results;
    binding_sites_.findOverlapping(old_start, pol->stop(), results);
    for (auto &interval : results) {
      interval.value->Uncover();
      if (interval.value->WasUncovered()) {
        // Record changes that species was covered
        LogUncover(interval.value->name());
      }
      interval.value->ResetState();
    }
    return;
  }

  auto transcript = polymerases_.GetAttached(pol_index);
  if (transcript != nullptr) {
    transcript->ShiftMask();
  }

  // Update propensity for new codon (TODO: make its own function)
  if (pol->name() == "__ribosome") {
    polymerases_.UpdatePropensity(pol_index);
  }
}